

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O3

void OpenSteer::OpenSteerDemo::updateSimulationAndRedraw(void)

{
  Clock::update(&clock);
  phaseTimers[2] = 0.0;
  phaseTimers[0] = 0.0;
  phaseTimers[1] = 0.0;
  phaseTimerBase = clock.totalRealTime;
  updateSelectedPlugIn(clock.totalSimulationTime,clock.elapsedSimulationTime);
  redrawSelectedPlugIn(clock.totalRealTime,clock.elapsedRealTime);
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::updateSimulationAndRedraw (void)
{
    // update global simulation clock
    clock.update ();

    //  start the phase timer (XXX to accurately measure "overhead" time this
    //  should be in displayFunc, or somehow account for time outside this
    //  routine)
    initPhaseTimers ();

    // run selected PlugIn (with simulation's current time and step size)
    updateSelectedPlugIn (clock.getTotalSimulationTime (),
                          clock.getElapsedSimulationTime ());

    // redraw selected PlugIn (based on real time)
    redrawSelectedPlugIn (clock.getTotalRealTime (),
                          clock.getElapsedRealTime ());
}